

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

uchar * glfwGetJoystickHats(int jid,int *count)

{
  GLFWbool GVar1;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/glfw/src/input.c"
                  ,0x467,"const unsigned char *glfwGetJoystickHats(int, int *)");
  }
  if (0xf < jid) {
    __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                  "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/glfw/src/input.c"
                  ,0x468,"const unsigned char *glfwGetJoystickHats(int, int *)");
  }
  if (count == (int *)0x0) {
    __assert_fail("count != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/glfw/src/input.c"
                  ,0x469,"const unsigned char *glfwGetJoystickHats(int, int *)");
  }
  *count = 0;
  if (_glfw.initialized != 0) {
    if ((_glfw.joysticksInitialized == 0) && (GVar1 = (*_glfw.platform.initJoysticks)(), GVar1 == 0)
       ) {
      (*_glfw.platform.terminateJoysticks)();
    }
    else {
      _glfw.joysticksInitialized = 1;
      if ((_glfw.joysticks[(uint)jid].connected != 0) &&
         (GVar1 = (*_glfw.platform.pollJoystick)(_glfw.joysticks + (uint)jid,2), GVar1 != 0)) {
        *count = _glfw.joysticks[(uint)jid].hatCount;
        return _glfw.joysticks[(uint)jid].hats;
      }
    }
    return (uchar *)0x0;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return (uchar *)0x0;
}

Assistant:

char* glfwGetJoystickHats(int jid, int* count)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);
    assert(count != NULL);

    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return NULL;
    }

    if (!initJoysticks())
        return NULL;

    js = _glfw.joysticks + jid;
    if (!js->connected)
        return NULL;

    if (!_glfw.platform.pollJoystick(js, _GLFW_POLL_BUTTONS))
        return NULL;

    *count = js->hatCount;
    return js->hats;
}